

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvaxtstart.c
# Opt level: O2

int main(int argc,char **argv)

{
  void *pvVar1;
  nva_card *pnVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  FILE *__stream;
  long lVar6;
  char *__ptr;
  uint32_t word;
  uint uVar7;
  ulong uVar8;
  size_t sStack_40;
  int cnum;
  uint local_34;
  
  _cnum = in_RAX;
  iVar4 = nva_init();
  if (iVar4 == 0) {
    _cnum = 0;
    do {
      while( true ) {
        while( true ) {
          while (iVar4 = getopt(argc,argv,"c:bv"), iVar4 == 99) {
            __isoc99_sscanf(_optarg,"%d",&cnum);
          }
          if (iVar4 != 0x62) break;
          _cnum = CONCAT44(0x103000,cnum);
        }
        if (iVar4 != 0x76) break;
        _cnum = CONCAT44(0xf000,cnum);
      }
    } while (iVar4 != -1);
    if (cnum < nva_cardsnum) {
      uVar3 = local_34;
      if (local_34 == 0) {
        __ptr = "No engine specified. Specify -b for PBSP, -v for PVP\n";
        sStack_40 = 0x35;
      }
      else {
        if (_optind < argc) {
          __stream = fopen(argv[_optind],"rb");
          if (__stream == (FILE *)0x0) {
            fprintf(_stderr,"Binary file %s could not be opened.\n",argv[_optind]);
            return 1;
          }
          fprintf(_stderr,"Uploading file %s.\n",argv[_optind]);
          pvVar1 = nva_cards[cnum].bar0;
          *(undefined4 *)((long)pvVar1 + 0x200) = 0x40110011;
          *(undefined4 *)((long)pvVar1 + 0x200) = 0xffffffff;
          usleep(1000);
          pnVar2 = nva_cards;
          pvVar1 = nva_cards[cnum].bar0;
          *(undefined4 *)((long)pvVar1 + 0x1700) = 0x10;
          lVar6 = (ulong)(uVar3 == 0x103000) * 0x40;
          *(undefined4 *)(lVar6 + 0x701040 + (long)pvVar1) = 0x190000;
          *(undefined4 *)(lVar6 + 0x701044 + (long)pvVar1) = 0x3fffff;
          *(undefined4 *)(lVar6 + 0x701048 + (long)pvVar1) = 0x300000;
          *(undefined4 *)(lVar6 + 0x70104c + (long)pvVar1) = 0;
          *(undefined4 *)(lVar6 + 0x701050 + (long)pvVar1) = 0;
          *(undefined4 *)(lVar6 + 0x701054 + (long)pvVar1) = 0;
          *(undefined4 *)((long)pvVar1 + 0x1700) = 0x30;
          *(undefined4 *)((long)pvVar1 + 0x700000) = 0;
          *(undefined4 *)((long)pvVar1 + 0x1700) = 0x20;
          for (uVar8 = 0; uVar8 < 0x100000; uVar8 = uVar8 + 4) {
            *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0x700000) = 0xffff06;
          }
          uVar8 = 0;
          do {
            uVar7 = 0;
            for (iVar4 = 0; iVar4 != 0x20; iVar4 = iVar4 + 8) {
              uVar5 = fgetc(__stream);
              pnVar2 = nva_cards;
              if (uVar5 == 0xffffffff) {
                *(uint *)((long)nva_cards[cnum].bar0 + (uVar8 & 0xffffffff) + 0x700000) = uVar7;
                pvVar1 = pnVar2[cnum].bar0;
                *(undefined4 *)((long)pvVar1 + 0x70000) = 1;
                do {
                } while (*(int *)((long)pvVar1 + 0x70000) != 0);
                usleep(1000);
                pnVar2 = nva_cards;
                uVar8 = (ulong)uVar3;
                *(undefined4 *)((long)nva_cards[cnum].bar0 + uVar8 + 0xd10) = 0x1fffffff;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xd08) = 0xfffffff;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xd28) = 0x90044;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xcc0) = 0x2000;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xcc4) = 0x1c;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xcc8) = 0x400;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xce4) = 0;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xce8) = 0xf;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xcec) = 0x404;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xc20) = 0x3f;
                *(undefined4 *)((long)pnVar2[cnum].bar0 + uVar8 + 0xd84) = 0x3f;
                pvVar1 = pnVar2[cnum].bar0;
                *(uint *)((long)pvVar1 + 0x1588) = *(uint *)((long)pvVar1 + 0x1588) & 0xffff0000;
                *(undefined4 *)((long)pvVar1 + 0x2500) = 1;
                *(undefined4 *)((long)pvVar1 + 0x3200) = 1;
                *(undefined4 *)((long)pvVar1 + 0x3250) = 1;
                *(undefined4 *)((long)pvVar1 + 0x1700) = 0x10;
                *(undefined4 *)((long)pvVar1 + 0x700f00) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f04) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f08) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f0c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f10) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f14) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f18) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f1c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f20) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f24) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f28) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f2c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f30) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f34) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f38) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f3c) = 0x403f6078;
                *(undefined4 *)((long)pvVar1 + 0x700f40) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f44) = 0x2101ffff;
                *(undefined4 *)((long)pvVar1 + 0x700f48) = 0x10;
                *(undefined4 *)((long)pvVar1 + 0x700f4c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f50) = 0x110000;
                *(undefined4 *)((long)pvVar1 + 0x700f54) = 0x80000;
                *(undefined4 *)((long)pvVar1 + 0x700f58) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f5c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f60) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f64) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f68) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f6c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f70) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f74) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f78) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f7c) = 0x30000fff;
                *(undefined4 *)((long)pvVar1 + 0x700f80) = 0x4000600;
                *(undefined4 *)((long)pvVar1 + 0x700f84) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f88) = 0x410;
                *(undefined4 *)((long)pvVar1 + 0x700f8c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f90) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f94) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700f98) = 0x101;
                *(undefined4 *)((long)pvVar1 + 0x700e00) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e04) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e08) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e0c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e10) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e14) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e18) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e1c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e20) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e24) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e28) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e2c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e30) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e34) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e38) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e3c) = 0x403f6078;
                *(undefined4 *)((long)pvVar1 + 0x700e40) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e44) = 0x2101ffff;
                *(undefined4 *)((long)pvVar1 + 0x700e48) = 0x10;
                *(undefined4 *)((long)pvVar1 + 0x700e4c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e50) = 0x110000;
                *(undefined4 *)((long)pvVar1 + 0x700e54) = 0x80000;
                *(undefined4 *)((long)pvVar1 + 0x700e58) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e5c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e60) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e64) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e68) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e6c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e70) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e74) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e78) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e7c) = 0x30000fff;
                *(undefined4 *)((long)pvVar1 + 0x700e80) = 0x4000600;
                *(undefined4 *)((long)pvVar1 + 0x700e84) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e88) = 0x410;
                *(undefined4 *)((long)pvVar1 + 0x700e8c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e90) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e94) = 0;
                *(undefined4 *)((long)pvVar1 + 0x700e98) = 0x101;
                for (uVar8 = 0; lVar6 = (long)cnum, uVar8 < 0x1001; uVar8 = uVar8 + 4) {
                  *(undefined4 *)((long)pnVar2[lVar6].bar0 + uVar8 + 0x706000) = 0;
                }
                pvVar1 = pnVar2[lVar6].bar0;
                *(undefined4 *)((long)pvVar1 + 0x707008) = 1;
                *(uint *)((long)pvVar1 + 0x70700c) = (uint)(uVar3 == 0x103000) << 0x15 | 0x400004;
                pvVar1 = nva_cards[lVar6].bar0;
                *(undefined4 *)((long)pvVar1 + 0x701100) = 0x19003d;
                *(undefined4 *)((long)pvVar1 + 0x701104) = 0xffffffff;
                *(undefined4 *)((long)pvVar1 + 0x701108) = 0;
                *(undefined4 *)((long)pvVar1 + 0x70110c) = 0;
                *(undefined4 *)((long)pvVar1 + 0x701110) = 0;
                *(undefined4 *)((long)pvVar1 + 0x701114) = 0;
                *(undefined4 *)((long)pvVar1 + 0x709000) = 1;
                *(undefined4 *)((long)pvVar1 + 0x70000) = 1;
                do {
                } while (*(int *)((long)pvVar1 + 0x70000) != 0);
                *(undefined4 *)((long)pvVar1 + 0x2600) = 0x8000100d;
                *(undefined4 *)((long)pvVar1 + 0x2604) = 0xc000100f;
                *(undefined4 *)((long)pvVar1 + 0x27fc) = 0x8000100e;
                *(undefined4 *)((long)pvVar1 + 0x32f4) = 0x109;
                *(undefined4 *)((long)pvVar1 + 0x32ec) = 1;
                *(undefined4 *)((long)pvVar1 + 0x2500) = 0x101;
                *(undefined4 *)((long)pvVar1 + 0x720000) = 0x40000;
                *(undefined4 *)((long)pvVar1 + 0x720004) = 1;
                *(undefined4 *)((long)pvVar1 + 0x710000) = 0x120000;
                *(undefined4 *)((long)pvVar1 + 0x710004) = 0x8000;
                *(undefined4 *)((long)pvVar1 + 0x70000) = 1;
                do {
                } while (*(int *)((long)pvVar1 + 0x70000) != 0);
                *(undefined4 *)((long)pvVar1 + 0xc0208c) = 1;
                return 0;
              }
              uVar7 = uVar7 | (uVar5 & 0xff) << ((byte)iVar4 & 0x1f);
            }
            *(uint *)((long)nva_cards[cnum].bar0 + uVar8 + 0x700000) = uVar7;
            uVar8 = uVar8 + 4;
          } while( true );
        }
        __ptr = "At least specify payload file.\n";
        sStack_40 = 0x1f;
      }
    }
    else if (nva_cardsnum == 0) {
      __ptr = "No cards found.\n";
      sStack_40 = 0x10;
    }
    else {
      __ptr = "No such card.\n";
      sStack_40 = 0xe;
    }
  }
  else {
    __ptr = "PCI init failure!\n";
    sStack_40 = 0x12;
  }
  fwrite(__ptr,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	uint32_t base = 0;
	while ((c = getopt (argc, argv, "c:bv")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
				base = 0x103000;
				break;
			case 'v':
				base = 0xf000;
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PBSP, -v for PVP\n");
		return 1;
	}
	
	if (optind >= argc) {
	    fprintf(stderr, "At least specify payload file.\n");
	    return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");
    
    if (payload == NULL) {
        fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
        return 1;
    } else {
        fprintf(stderr, "Uploading file %s.\n", argv[optind]);
    }
    
    int32_t i;
	nva_wr32(cnum, 0x200, 0x40110011);
	nva_wr32(cnum, 0x200, 0xffffffff);
	usleep(1000);
	nva_wr32(cnum, 0x1700, 0x10);
	if (base == 0x103000) {
		nva_wr32(cnum, 0x701080, 0x00190000);
		nva_wr32(cnum, 0x701084, 0x003fffff);
		nva_wr32(cnum, 0x701088, 0x00300000);
		nva_wr32(cnum, 0x70108c, 0x00000000);
		nva_wr32(cnum, 0x701090, 0x00000000);
		nva_wr32(cnum, 0x701094, 0x00000000);
	} else {
		nva_wr32(cnum, 0x701040, 0x00190000);
		nva_wr32(cnum, 0x701044, 0x003fffff);
		nva_wr32(cnum, 0x701048, 0x00300000);
		nva_wr32(cnum, 0x70104c, 0x00000000);
		nva_wr32(cnum, 0x701050, 0x00000000);
		nva_wr32(cnum, 0x701054, 0x00000000);
	}
	nva_wr32(cnum, 0x1700, 0x30);
	nva_wr32(cnum, 0x700000, 0x00000000);
	nva_wr32(cnum, 0x1700, 0x20);
	for (i = 0; i < 0x100000; i+= 4)
		nva_wr32(cnum, 0x700000 + i, 0xffff06);
		
	for (i = 0; ; i += 4) {
	    uint32_t word = 0;
	    int y;
	    int character = 0;
	    for (y = 0; y < 4; y++) {
    		character = fgetc(payload);
    		if (character == EOF) {
    		    break;
    		}
    		word |= ((unsigned char)character) << (y * 8);
    	}
    	nva_wr32(cnum, 0x700000 + i, word);
   		if (character == EOF) {
   		    break;
   		}
	}
	
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	usleep(1000);
	nva_wr32(cnum, base+0xd10, 0x1fffffff);
	nva_wr32(cnum, base+0xd08, 0xfffffff);
	nva_wr32(cnum, base+0xd28, 0x90044);
	nva_wr32(cnum, base+0xcc0, 0x2000);
	nva_wr32(cnum, base+0xcc4, 0x1c);
	nva_wr32(cnum, base+0xcc8, 0x400);
	nva_wr32(cnum, base+0xce4, 0x0000);
	nva_wr32(cnum, base+0xce8, 0x0f);
	nva_wr32(cnum, base+0xcec, 0x404);
	nva_wr32(cnum, base+0xc20, 0x3f);
	nva_wr32(cnum, base+0xd84, 0x3f);
	nva_wr32(cnum, 0x1588, nva_rd32(cnum, 0x1588) & ~0xffff);
	nva_wr32(cnum, 0x2500, 1);
	nva_wr32(cnum, 0x3200, 1);
	nva_wr32(cnum, 0x3250, 1);
	nva_wr32(cnum, 0x1700, 0x10);
	nva_wr32(cnum, 0x700000+0xf00, 0);
	nva_wr32(cnum, 0x700000+0xf04, 0);
	nva_wr32(cnum, 0x700000+0xf08, 0);
	nva_wr32(cnum, 0x700000+0xf0c, 0);
	nva_wr32(cnum, 0x700000+0xf10, 0);
	nva_wr32(cnum, 0x700000+0xf14, 0);
	nva_wr32(cnum, 0x700000+0xf18, 0);
	nva_wr32(cnum, 0x700000+0xf1c, 0);
	nva_wr32(cnum, 0x700000+0xf20, 0);
	nva_wr32(cnum, 0x700000+0xf24, 0);
	nva_wr32(cnum, 0x700000+0xf28, 0);
	nva_wr32(cnum, 0x700000+0xf2c, 0);
	nva_wr32(cnum, 0x700000+0xf30, 0);
	nva_wr32(cnum, 0x700000+0xf34, 0);
	nva_wr32(cnum, 0x700000+0xf38, 0);
	nva_wr32(cnum, 0x700000+0xf3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xf40, 0);
	nva_wr32(cnum, 0x700000+0xf44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xf48, 0x10);
	nva_wr32(cnum, 0x700000+0xf4c, 0);
	nva_wr32(cnum, 0x700000+0xf50, 0x110000);
	nva_wr32(cnum, 0x700000+0xf54, 0x80000);
	nva_wr32(cnum, 0x700000+0xf58, 0);
	nva_wr32(cnum, 0x700000+0xf5c, 0);
	nva_wr32(cnum, 0x700000+0xf60, 0);
	nva_wr32(cnum, 0x700000+0xf64, 0);
	nva_wr32(cnum, 0x700000+0xf68, 0);
	nva_wr32(cnum, 0x700000+0xf6c, 0);
	nva_wr32(cnum, 0x700000+0xf70, 0);
	nva_wr32(cnum, 0x700000+0xf74, 0);
	nva_wr32(cnum, 0x700000+0xf78, 0);
	nva_wr32(cnum, 0x700000+0xf7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xf80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xf84, 0);
	nva_wr32(cnum, 0x700000+0xf88, 0x410);
	nva_wr32(cnum, 0x700000+0xf8c, 0);
	nva_wr32(cnum, 0x700000+0xf90, 0);
	nva_wr32(cnum, 0x700000+0xf94, 0);
	nva_wr32(cnum, 0x700000+0xf98, 0x101);

	nva_wr32(cnum, 0x700000+0xe00, 0);
	nva_wr32(cnum, 0x700000+0xe04, 0);
	nva_wr32(cnum, 0x700000+0xe08, 0);
	nva_wr32(cnum, 0x700000+0xe0c, 0);
	nva_wr32(cnum, 0x700000+0xe10, 0);
	nva_wr32(cnum, 0x700000+0xe14, 0);
	nva_wr32(cnum, 0x700000+0xe18, 0);
	nva_wr32(cnum, 0x700000+0xe1c, 0);
	nva_wr32(cnum, 0x700000+0xe20, 0);
	nva_wr32(cnum, 0x700000+0xe24, 0);
	nva_wr32(cnum, 0x700000+0xe28, 0);
	nva_wr32(cnum, 0x700000+0xe2c, 0);
	nva_wr32(cnum, 0x700000+0xe30, 0);
	nva_wr32(cnum, 0x700000+0xe34, 0);
	nva_wr32(cnum, 0x700000+0xe38, 0);
	nva_wr32(cnum, 0x700000+0xe3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xe40, 0);
	nva_wr32(cnum, 0x700000+0xe44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xe48, 0x10);
	nva_wr32(cnum, 0x700000+0xe4c, 0);
	nva_wr32(cnum, 0x700000+0xe50, 0x110000);
	nva_wr32(cnum, 0x700000+0xe54, 0x80000);
	nva_wr32(cnum, 0x700000+0xe58, 0);
	nva_wr32(cnum, 0x700000+0xe5c, 0);
	nva_wr32(cnum, 0x700000+0xe60, 0);
	nva_wr32(cnum, 0x700000+0xe64, 0);
	nva_wr32(cnum, 0x700000+0xe68, 0);
	nva_wr32(cnum, 0x700000+0xe6c, 0);
	nva_wr32(cnum, 0x700000+0xe70, 0);
	nva_wr32(cnum, 0x700000+0xe74, 0);
	nva_wr32(cnum, 0x700000+0xe78, 0);
	nva_wr32(cnum, 0x700000+0xe7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xe80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xe84, 0);
	nva_wr32(cnum, 0x700000+0xe88, 0x410);
	nva_wr32(cnum, 0x700000+0xe8c, 0);
	nva_wr32(cnum, 0x700000+0xe90, 0);
	nva_wr32(cnum, 0x700000+0xe94, 0);
	nva_wr32(cnum, 0x700000+0xe98, 0x101);
	for (i = 0; i <= 0x1000; i+= 4)
		nva_wr32(cnum, 0x700000+0x6000 + i, 0);
	nva_wr32(cnum, 0x700000+0x7008, 0x1);
	if (base == 0x103000)
		nva_wr32(cnum, 0x700000+0x700c, 0x00600004);
	else
		nva_wr32(cnum, 0x700000+0x700c, 0x00400004);
	nva_wr32(cnum, 0x700000+0x1100, 0x0019003d);
	nva_wr32(cnum, 0x700000+0x1104, 0xffffffff);
	nva_wr32(cnum, 0x700000+0x1108, 0);
	nva_wr32(cnum, 0x700000+0x110c, 0);
	nva_wr32(cnum, 0x700000+0x1110, 0);
	nva_wr32(cnum, 0x700000+0x1114, 0);
	nva_wr32(cnum, 0x700000+0x9000, 1);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0x2600, 0x8000100d);
	nva_wr32(cnum, 0x2604, 0xc000100f);
	nva_wr32(cnum, 0x27fc, 0x8000100e);
	nva_wr32(cnum, 0x32f4, 0x109);
	nva_wr32(cnum, 0x32ec, 0x1);
	nva_wr32(cnum, 0x2500, 0x101);
	nva_wr32(cnum, 0x700000+0x20000, 0x00040000);
	nva_wr32(cnum, 0x700000+0x20004, 0x00000001);
	nva_wr32(cnum, 0x700000+0x10000, 0x00120000);
	nva_wr32(cnum, 0x700000+0x10004, 0x00008000);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0xc0208c, 1);
	return 0;
}